

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::
Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
::walkFunctionInModule
          (Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
           *this,Function *func,Module *module)

{
  this->currModule = module;
  this->currFunction = func;
  SimplifyLocals<true,_false,_true>::doWalkFunction
            ((SimplifyLocals<true,_false,_true> *)&this[-1].stack.fixed._M_elems[9].currp,func);
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }